

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_chasm_bin.cpp
# Opt level: O0

void __thiscall FChasmBinFile::DumpFiles(FChasmBinFile *this,char *path)

{
  uint uVar1;
  FResourceLump **ppFVar2;
  char *pcVar3;
  FILE *__stream;
  long *plVar4;
  long lVar5;
  size_t __size;
  long bytesRead;
  long bytesToRead;
  uchar buffer [4096];
  long local_440;
  long bytesLeft;
  FileReader *reader;
  FILE *file;
  char filename [1024];
  FResourceLump *lump;
  DWORD count;
  DWORD i;
  char *path_local;
  FChasmBinFile *this_local;
  
  CreatePath(path);
  lump._4_4_ = 0;
  uVar1 = TArray<FResourceLump_*,_FResourceLump_*>::Size(&this->m_lumps);
  do {
    if (uVar1 <= lump._4_4_) {
      return;
    }
    ppFVar2 = TArray<FResourceLump_*,_FResourceLump_*>::operator[](&this->m_lumps,(ulong)lump._4_4_)
    ;
    filename._1016_8_ = *ppFVar2;
    memset(&file,0,0x400);
    pcVar3 = FString::GetChars((FString *)(filename._1016_8_ + 0x10));
    mysnprintf((char *)&file,0x400,"%s/%s",path,pcVar3);
    __stream = fopen((char *)&file,"wb");
    if (__stream != (FILE *)0x0) {
      plVar4 = (long *)(**(code **)(*(long *)filename._1016_8_ + 0x10))();
      if (plVar4 == (long *)0x0) {
        __assert_fail("NULL != reader",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/file_chasm_bin.cpp"
                      ,0x1fd,"void FChasmBinFile::DumpFiles(const char *const)");
      }
      for (local_440 = (long)*(int *)(filename._1016_8_ + 8); 0 < local_440;
          local_440 = local_440 - __size) {
        lVar5 = MIN<long>(local_440,0x1000);
        __size = (**(code **)(*plVar4 + 0x10))(plVar4,&bytesToRead,lVar5);
        fwrite(&bytesToRead,__size,1,__stream);
      }
      fclose(__stream);
    }
    lump._4_4_ = lump._4_4_ + 1;
  } while( true );
}

Assistant:

void FChasmBinFile::DumpFiles(const char* const path)
{
	CreatePath(path);

	for (DWORD i = 0, count = m_lumps.Size(); i < count; ++i)
	{
		FResourceLump* const lump = m_lumps[i];

		char filename[1024] = {};
		mysnprintf(filename, sizeof filename, "%s/%s", path, lump->FullName.GetChars());

		FILE* const file = fopen(filename, "wb");
		if (NULL == file)
		{
			continue;
		}

		FileReader* reader = lump->GetReader();
		assert(NULL != reader);

		for (long bytesLeft = lump->LumpSize; bytesLeft > 0; /* EMPTY */)
		{
			unsigned char buffer[4096];

			const long bytesToRead = MIN(bytesLeft, long(sizeof buffer));
			const long bytesRead = reader->Read(buffer, bytesToRead);

			fwrite(buffer, bytesRead, 1, file);

			bytesLeft -= bytesRead;
		}

		fclose(file);
	}
}